

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_stdin.c
# Opt level: O0

int main(void)

{
  size_t sVar1;
  size_t nOut;
  size_t nIn;
  char buf [1024];
  
  nOut = 0x400;
  do {
    if (nOut != 0x400) {
      return 0;
    }
    nOut = fread(&nIn,1,0x400,_stdin);
  } while ((nOut == 0) || (sVar1 = fwrite(&nIn,1,nOut,_stdout), sVar1 == nOut));
  return 1;
}

Assistant:

int main(void)
{
  char buf[1024];
  size_t nIn = sizeof(buf);
  while (nIn == sizeof(buf)) {
    nIn = fread(buf, 1, sizeof(buf), stdin);
    if (nIn > 0) {
      size_t nOut;
      nOut = fwrite(buf, 1, nIn, stdout);
      if (nOut != nIn) {
        return 1;
      }
    }
  }
  return 0;
}